

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

uint8_t mpack_expect_native_u8(mpack_reader_t *reader)

{
  _Bool _Var1;
  uint8_t uVar2;
  
  if (reader->error != mpack_ok) {
    return '\0';
  }
  _Var1 = mpack_reader_ensure(reader,1);
  if (_Var1) {
    uVar2 = *reader->data;
    reader->data = reader->data + 1;
  }
  else {
    uVar2 = '\0';
  }
  return uVar2;
}

Assistant:

MPACK_STATIC_INLINE uint8_t mpack_expect_native_u8(mpack_reader_t* reader) {
    if (mpack_reader_error(reader) != mpack_ok)
        return 0;
    uint8_t type;
    if (!mpack_reader_ensure(reader, sizeof(type)))
        return 0;
    type = mpack_load_u8(reader->data);
    reader->data += sizeof(type);
    return type;
}